

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericMouseInput.cpp
# Opt level: O1

void __thiscall fw::GenericMouseInput::nextFrame(GenericMouseInput *this)

{
  double dVar1;
  double dVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (*(int *)((long)this->_buttonStates + lVar3) == 2) {
      *(undefined4 *)((long)this->_buttonStates + lVar3) = 1;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x80);
  dVar1 = (this->_currentPosition).field_0.field_0.y;
  (this->_previousPosition).field_0.field_0.x = (this->_currentPosition).field_0.field_0.x;
  (this->_previousPosition).field_0.field_0.y = dVar1;
  dVar1 = (this->_currentPosition).field_0.field_0.y;
  dVar2 = (this->_previousPosition).field_0.field_0.y;
  (this->_movement).field_0.field_0.x =
       (this->_currentPosition).field_0.field_0.x - (this->_previousPosition).field_0.field_0.x;
  (this->_movement).field_0.field_0.y = dVar1 - dVar2;
  return;
}

Assistant:

void GenericMouseInput::nextFrame()
{
    changeTapsToPresses();
    _previousPosition = _currentPosition;
    _movement = _currentPosition - _previousPosition;
}